

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

void __thiscall csv::CSVReader::trim_header(CSVReader *this)

{
  int iVar1;
  ThreadSafeDeque<csv::CSVRow> *this_00;
  element_type *peVar2;
  CSVRow *pCVar3;
  int iVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_98;
  CSVRow local_80;
  CSVRow local_58;
  
  if (this->header_trimmed == false) {
    iVar4 = 0;
    while ((iVar1 = (this->_format).header, iVar4 <= iVar1 &&
           (this_00 = (this->records)._M_t.
                      super___uniq_ptr_impl<csv::internals::ThreadSafeDeque<csv::CSVRow>,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>_>_>
                      .super__Head_base<0UL,_csv::internals::ThreadSafeDeque<csv::CSVRow>_*,_false>.
                      _M_head_impl,
           ((iterator *)
           ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> +
           0x30))->_M_cur !=
           ((iterator *)
           ((long)&(this_00->data).super__Deque_base<csv::CSVRow,_std::allocator<csv::CSVRow>_> +
           0x10))->_M_cur))) {
      if ((iVar4 == iVar1) &&
         (peVar2 = (this->col_names).
                   super___shared_ptr<csv::internals::ColNames,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (peVar2->col_names).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (peVar2->col_names).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) {
        internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_80,this_00);
        CSVRow::operator_cast_to_vector(&vStack_98,&local_80);
        set_col_names(this,&vStack_98);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_98);
        pCVar3 = &local_80;
      }
      else {
        internals::ThreadSafeDeque<csv::CSVRow>::pop_front(&local_58,this_00);
        pCVar3 = &local_58;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pCVar3->data).
                  super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      iVar4 = iVar4 + 1;
    }
    this->header_trimmed = true;
  }
  return;
}

Assistant:

CSV_INLINE void CSVReader::trim_header() {
        if (!this->header_trimmed) {
            for (int i = 0; i <= this->_format.header && !this->records->empty(); i++) {
                if (i == this->_format.header && this->col_names->empty()) {
                    this->set_col_names(this->records->pop_front());
                }
                else {
                    this->records->pop_front();
                }
            }

            this->header_trimmed = true;
        }
    }